

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O0

hbtrie_result hbtrie_find_partial(hbtrie *trie,void *rawkey,int rawkeylen,void *valuebuf)

{
  long lVar1;
  undefined1 *key_00;
  void *valuebuf_00;
  void *trie_00;
  int keylen_00;
  hbtrie_result hVar2;
  undefined8 uStack_50;
  undefined1 auStack_48 [12];
  int local_3c;
  undefined1 *puStack_38;
  int keylen;
  uint8_t *key;
  void *pvStack_28;
  int nchunk;
  void *valuebuf_local;
  void *pvStack_18;
  int rawkeylen_local;
  void *rawkey_local;
  hbtrie *trie_local;
  
  uStack_50 = 0x155ae7;
  pvStack_28 = valuebuf;
  valuebuf_local._4_4_ = rawkeylen;
  pvStack_18 = rawkey;
  rawkey_local = trie;
  key._4_4_ = _get_nchunk_raw(trie,rawkey,rawkeylen);
  lVar1 = -((long)(int)(key._4_4_ * (uint)*rawkey_local) + 0xfU & 0xfffffffffffffff0);
  puStack_38 = auStack_48 + lVar1;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x155b23;
  keylen_00 = _hbtrie_reform_key(*(hbtrie **)((long)&stack0xffffffffffffffe8 + lVar1),
                                 *(void **)((long)&valuebuf_local + lVar1),
                                 *(int *)((long)&nchunk + lVar1),*(void **)((long)&key + lVar1));
  trie_00 = rawkey_local;
  valuebuf_00 = pvStack_28;
  key_00 = puStack_38;
  local_3c = keylen_00;
  *(undefined8 *)(auStack_48 + lVar1 + -8) = 0x155b45;
  hVar2 = _hbtrie_find((hbtrie *)trie_00,key_00,keylen_00,valuebuf_00,(list *)0x0,'\x02');
  return hVar2;
}

Assistant:

hbtrie_result hbtrie_find_partial(struct hbtrie *trie, void *rawkey,
                                  int rawkeylen, void *valuebuf)
{
    int nchunk = _get_nchunk_raw(trie, rawkey, rawkeylen);
    uint8_t *key = alca(uint8_t, nchunk * trie->chunksize);
    int keylen;

    keylen = _hbtrie_reform_key(trie, rawkey, rawkeylen, key);
    return _hbtrie_find(trie, key, keylen, valuebuf, NULL,
                        HBTRIE_PARTIAL_MATCH);
}